

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

Option * __thiscall CLI::App::operator[](App *this,string *option_name)

{
  pointer pcVar1;
  Option *pOVar2;
  string local_38;
  
  pcVar1 = (option_name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + option_name->_M_string_length);
  pOVar2 = get_option(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return pOVar2;
}

Assistant:

const Option *operator[](const std::string &option_name) const { return get_option(option_name); }